

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBorderClampFormatCase::TextureBorderClampFormatCase
          (TextureBorderClampFormatCase *this,Context *context,char *name,char *description,
          deUint32 texFormat,DepthStencilMode mode,StateType stateType,SizeType sizeType,
          deUint32 filter,SamplingFunction samplingFunction)

{
  bool bVar1;
  StateType stateType_00;
  int texWidth;
  deUint32 in_stack_ffffffffffffffc8;
  IVec3 blockPixelSize;
  
  stateType_00 = 0x11;
  if (stateType == STATE_SAMPLER_PARAM) {
    stateType_00 = 0x20;
  }
  texWidth = 0x1f;
  if (stateType == STATE_SAMPLER_PARAM) {
    texWidth = 0x10;
  }
  TextureBorderClampTest::TextureBorderClampTest
            (&this->super_TextureBorderClampTest,context,name,
             (char *)((ulong)description & 0xffffffff),texFormat,mode,stateType_00,texWidth,filter,
             SAMPLE_FILTER,in_stack_ffffffffffffffc8);
  (this->super_TextureBorderClampTest).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureBorderClampFormatCase_00b4f308;
  this->m_sizeType = stateType;
  this->m_filter = sizeType;
  (this->m_iterations).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_iterations).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_iterations).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = glu::isCompressedFormat((deUint32)description);
  if (bVar1) {
    glu::mapGLCompressedTexFormat((deUint32)description);
    tcu::getBlockPixelSize((CompressedTexFormat)&blockPixelSize);
  }
  return;
}

Assistant:

TextureBorderClampFormatCase::TextureBorderClampFormatCase	(Context&						context,
															 const char*					name,
															 const char*					description,
															 deUint32						texFormat,
															 tcu::Sampler::DepthStencilMode	mode,
															 StateType						stateType,
															 SizeType						sizeType,
															 deUint32						filter,
															 SamplingFunction				samplingFunction)
	: TextureBorderClampTest(context,
							 name,
							 description,
							 texFormat,
							 mode,
							 stateType,
							 (sizeType == SIZE_POT) ? (32) : (17),
							 (sizeType == SIZE_POT) ? (16) : (31),
							 samplingFunction)
	, m_sizeType			(sizeType)
	, m_filter				(filter)
{
	if (m_sizeType == SIZE_POT)
		DE_ASSERT(deIsPowerOfTwo32(m_texWidth) && deIsPowerOfTwo32(m_texHeight));
	else
		DE_ASSERT(!deIsPowerOfTwo32(m_texWidth) && !deIsPowerOfTwo32(m_texHeight));

	if (glu::isCompressedFormat(texFormat))
	{
		const tcu::CompressedTexFormat	compressedFormat	= glu::mapGLCompressedTexFormat(texFormat);
		const tcu::IVec3				blockPixelSize		= tcu::getBlockPixelSize(compressedFormat);

		// is (not) multiple of a block size
		if (m_sizeType == SIZE_POT)
			DE_ASSERT((m_texWidth % blockPixelSize.x()) == 0 && (m_texHeight % blockPixelSize.y()) == 0);
		else
			DE_ASSERT((m_texWidth % blockPixelSize.x()) != 0 && (m_texHeight % blockPixelSize.y()) != 0);

		DE_UNREF(blockPixelSize);
	}
}